

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_alignment_static_accs(void)

{
  char *__nptr;
  double dVar1;
  double dVar2;
  ulong local_38;
  size_t i;
  double n1_n;
  char *cfg_ptr;
  double t0_default;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char t0_token [10];
  
  t0_default._6_1_ = 'a';
  t0_default._7_1_ = 'l';
  cStack_10 = 'i';
  cStack_f = 'g';
  cStack_e = 'n';
  cStack_d = 'm';
  cStack_c = 'e';
  cStack_b = 'n';
  t0_token[0] = 't';
  t0_token[1] = '\0';
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_alignment_static_accs::n = 0;
      __nptr = fsnav_locate_token((char *)((long)&t0_default + 6),fsnav->imu->cfg,
                                  fsnav->imu->cfglength,'=');
      if ((__nptr == (char *)0x0) ||
         (fsnav_ins_alignment_static_accs::t0 = atof(__nptr),
         fsnav_ins_alignment_static_accs::t0 <= 0.0)) {
        fsnav_ins_alignment_static_accs::t0 = 300.0;
      }
    }
    else if ((-1 < fsnav->mode) && (fsnav->imu->t <= fsnav_ins_alignment_static_accs::t0)) {
      (fsnav->imu->sol).L_valid = '\0';
      (fsnav->imu->sol).q_valid = '\0';
      (fsnav->imu->sol).rpy_valid = '\0';
      if (fsnav->imu->f_valid != '\0') {
        fsnav_ins_alignment_static_accs::n = fsnav_ins_alignment_static_accs::n + 1;
        dVar1 = (double)fsnav_ins_alignment_static_accs::n;
        dVar2 = (double)fsnav_ins_alignment_static_accs::n;
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          fsnav_ins_alignment_static_accs::f[local_38] =
               fsnav_ins_alignment_static_accs::f[local_38] * ((dVar1 - 1.0) / dVar2) +
               fsnav->imu->f[local_38] / (double)fsnav_ins_alignment_static_accs::n;
        }
        dVar1 = atan2(-fsnav_ins_alignment_static_accs::f[2],fsnav_ins_alignment_static_accs::f[1]);
        (fsnav->imu->sol).rpy[0] = dVar1;
        dVar1 = fsnav_ins_alignment_static_accs::f[0];
        dVar2 = sqrt(fsnav_ins_alignment_static_accs::f[1] * fsnav_ins_alignment_static_accs::f[1] +
                     fsnav_ins_alignment_static_accs::f[2] * fsnav_ins_alignment_static_accs::f[2]);
        dVar1 = atan2(dVar1,dVar2);
        (fsnav->imu->sol).rpy[1] = dVar1;
        (fsnav->imu->sol).rpy[2] = 0.0;
      }
      (fsnav->imu->sol).rpy_valid = '\x01';
      fsnav_linal_rpy2mat((fsnav->imu->sol).L,(fsnav->imu->sol).rpy);
      (fsnav->imu->sol).L_valid = '\x01';
      fsnav_linal_mat2quat((fsnav->imu->sol).q,(fsnav->imu->sol).L);
      (fsnav->imu->sol).q_valid = '\x01';
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        (fsnav->imu->sol).v[local_38] = 0.0;
      }
      (fsnav->imu->sol).v_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_alignment_static_accs(void) {

	const char   t0_token[] = "alignment"; // параметр длительности выставки в конфигурационной строке
	const double t0_default = 300;         // стандартная длительность выставки

	static double 
		f[3] = {0,0,0}, // среднее значение показаний акселерометров
		t0      = -1;   // длительность выставки
	static int n = 0;   // счетчик количества измерений

	char   *cfg_ptr;    // указатель на параметр в строке конфигурации
	double  n1_n;       // (n-1)/n
	size_t  i;          // индекс

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// обнуление счетчика
		n = 0;
		// парсинг длительности выставки в конфигурационной строке
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// операции на каждом шаге
	else {
		// проверка времени выставки
		if (fsnav->imu->t > t0)
			return;
		// обнуление флагов достоверности
		fsnav->imu->sol.L_valid   = 0;
		fsnav->imu->sol.q_valid   = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// обновление среднего и углов ориентации
		if (fsnav->imu->f_valid) {
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++)
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n;

			fsnav->imu->sol.rpy[0] = atan2(-f[2], f[1]);
			fsnav->imu->sol.rpy[1] = atan2( f[0], sqrt(f[1]*f[1] + f[2]*f[2]));
			fsnav->imu->sol.rpy[2] = 0.0;
		}
		fsnav->imu->sol.rpy_valid = 1;
		// обновление матрицы ориентации
		fsnav_linal_rpy2mat(fsnav->imu->sol.L, fsnav->imu->sol.rpy);
		fsnav->imu->sol.L_valid = 1;
		// обновление кватерниона
		fsnav_linal_mat2quat(fsnav->imu->sol.q  , fsnav->imu->sol.L);
		fsnav->imu->sol.q_valid = 1;
		// обнуление скорости (поскольку предполагается статическая выставка)
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
	}
}